

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O2

void ClearMetadata(VP8LMetadata *hdr)

{
  WebPSafeFree(hdr->huffman_image);
  VP8LHuffmanTablesDeallocate(&hdr->huffman_tables);
  VP8LHtreeGroupsFree(hdr->htree_groups);
  VP8LColorCacheClear(&hdr->color_cache);
  VP8LColorCacheClear(&hdr->saved_color_cache);
  (hdr->huffman_tables).root.next = (HuffmanTablesSegment *)0x0;
  *(undefined8 *)&(hdr->huffman_tables).root.size = 0;
  (hdr->huffman_tables).root.start = (HuffmanCode *)0x0;
  (hdr->huffman_tables).root.curr_table = (HuffmanCode *)0x0;
  *(undefined8 *)&hdr->num_htree_groups = 0;
  hdr->htree_groups = (HTreeGroup *)0x0;
  *(undefined8 *)&hdr->huffman_xsize = 0;
  hdr->huffman_image = (uint32_t *)0x0;
  (hdr->saved_color_cache).hash_shift = 0;
  (hdr->saved_color_cache).hash_bits = 0;
  hdr->huffman_mask = 0;
  hdr->huffman_subsample_bits = 0;
  (hdr->color_cache).hash_shift = 0;
  (hdr->color_cache).hash_bits = 0;
  (hdr->saved_color_cache).colors = (uint32_t *)0x0;
  *(undefined8 *)hdr = 0;
  (hdr->color_cache).colors = (uint32_t *)0x0;
  (hdr->huffman_tables).curr_segment = (HuffmanTablesSegment *)0x0;
  return;
}

Assistant:

static void ClearMetadata(VP8LMetadata* const hdr) {
  assert(hdr != NULL);

  WebPSafeFree(hdr->huffman_image);
  VP8LHuffmanTablesDeallocate(&hdr->huffman_tables);
  VP8LHtreeGroupsFree(hdr->htree_groups);
  VP8LColorCacheClear(&hdr->color_cache);
  VP8LColorCacheClear(&hdr->saved_color_cache);
  InitMetadata(hdr);
}